

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteInitVm(unqlite *pDb,jx9_vm *pJx9Vm,unqlite_vm **ppOut)

{
  unqlite_vm *puVar1;
  unqlite_vm *pSrc;
  unqlite_col **pSrc_00;
  int iVar2;
  SyMemBackend *pBackend;
  long lVar3;
  
  *ppOut = (unqlite_vm *)0x0;
  pSrc = (unqlite_vm *)SyMemBackendPoolAlloc(&pDb->sMem,0xf8);
  iVar2 = -1;
  if (pSrc != (unqlite_vm *)0x0) {
    SyZero(pSrc,0xf8);
    pBackend = &pSrc->sAlloc;
    SyMemBackendInitFromParent(pBackend,&pDb->sMem);
    pSrc_00 = (unqlite_col **)SyMemBackendAlloc(pBackend,0x100);
    pSrc->apCol = pSrc_00;
    if (pSrc_00 == (unqlite_col **)0x0) {
      SyMemBackendRelease(pBackend);
      SyMemBackendPoolFree(&pDb->sMem,pSrc);
    }
    else {
      pSrc->iColSize = 0x20;
      SyZero(pSrc_00,0x100);
      pSrc->pJx9Vm = pJx9Vm;
      pSrc->pDb = pDb;
      puVar1 = pDb->pVms;
      if (puVar1 != (unqlite_vm *)0x0) {
        pSrc->pNext = puVar1;
        puVar1->pPrev = pSrc;
      }
      pDb->pVms = pSrc;
      pDb->iVm = pDb->iVm + 1;
      for (lVar3 = 8; lVar3 != 0x1f8; lVar3 = lVar3 + 0x10) {
        jx9_create_function(pSrc->pJx9Vm,
                            *(char **)(unqliteExportDiskKvStorage_sDiskStore + lVar3 + 0xb0),
                            *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                             ((long)&unqliteRegisterJx9Functions_aBuiltin + lVar3),pSrc);
      }
      pSrc->nMagic = 0xea12cd72;
      *ppOut = pSrc;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int unqliteInitVm(unqlite *pDb,jx9_vm *pJx9Vm,unqlite_vm **ppOut)
{
	unqlite_vm *pVm;

	*ppOut = 0;
	/* Allocate a new VM instance */
	pVm = (unqlite_vm *)SyMemBackendPoolAlloc(&pDb->sMem,sizeof(unqlite_vm));
	if( pVm == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pVm,sizeof(unqlite_vm));
	/* Initialize */
	SyMemBackendInitFromParent(&pVm->sAlloc,&pDb->sMem);
	/* Allocate a new collection table */
	pVm->apCol = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc,32 * sizeof(unqlite_col *)); 
	if( pVm->apCol == 0 ){
		goto fail;
	}
	pVm->iColSize = 32; /* Must be a power of two */
	/* Zero the table */
	SyZero((void *)pVm->apCol,pVm->iColSize * sizeof(unqlite_col *));
#if defined(UNQLITE_ENABLE_THREADS)
	if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pVm->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pVm->pMutex == 0 ){
			 goto fail;
		 }
	 }
#endif
	/* Link the VM to the list of active virtual machines */
	pVm->pJx9Vm = pJx9Vm;
	pVm->pDb = pDb;
	MACRO_LD_PUSH(pDb->pVms,pVm);
	pDb->iVm++;
	/* Register Jx9 functions */
	unqliteRegisterJx9Functions(pVm);
	/* Set the magic number */
	pVm->nMagic = JX9_VM_INIT; /* Same magic number as Jx9 */
	/* All done */
	*ppOut = pVm;
	return UNQLITE_OK;
fail:
	SyMemBackendRelease(&pVm->sAlloc);
	SyMemBackendPoolFree(&pDb->sMem,pVm);
	return UNQLITE_NOMEM;
}